

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_write_resp_hds(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  dynbuf *pdVar1;
  undefined1 *puVar2;
  uint uVar3;
  connectdata *conn;
  CURLcode CVar4;
  statusline sVar5;
  void *pvVar6;
  char *pcVar7;
  size_t len;
  size_t sVar8;
  size_t local_38;
  
  if (((data->req).field_0xd9 & 1) == 0) {
    *pconsumed = 0;
    CVar4 = CURLE_OK;
  }
  else {
    conn = data->conn;
    *pconsumed = 0;
    if (blen != 0) {
      pdVar1 = &(data->state).headerb;
      while (((data->req).field_0xd9 & 1) != 0) {
        pvVar6 = memchr(buf,10,blen);
        if (pvVar6 == (void *)0x0) {
          CVar4 = Curl_dyn_addn(pdVar1,buf,blen);
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
          *pconsumed = *pconsumed + blen;
          if ((data->req).headerline == 0) {
            pcVar7 = Curl_dyn_ptr(pdVar1);
            sVar8 = Curl_dyn_len(pdVar1);
            sVar5 = checkprotoprefix(data,(connectdata *)(ulong)conn->handler->protocol,pcVar7,sVar8
                                    );
            if (sVar5 == STATUS_BAD) {
              puVar2 = &(data->req).field_0xd9;
              *puVar2 = *puVar2 & 0xfe;
              Curl_conncontrol(conn,2);
              if (9 < conn->httpversion) {
LAB_00136605:
                CVar4 = CURLE_WEIRD_SERVER_REPLY;
                pcVar7 = "Invalid status line";
                goto LAB_0013662a;
              }
              if (((data->set).field_0x8d0 & 0x10) == 0) {
LAB_0013661d:
                CVar4 = CURLE_UNSUPPORTED_PROTOCOL;
                pcVar7 = "Received HTTP/0.9 when not allowed";
LAB_0013662a:
                Curl_failf(data,pcVar7);
                return CVar4;
              }
              goto LAB_00136576;
            }
          }
          break;
        }
        sVar8 = (long)pvVar6 + (1 - (long)buf);
        local_38 = sVar8;
        CVar4 = Curl_dyn_addn(pdVar1,buf,sVar8);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        *pconsumed = *pconsumed + sVar8;
        if ((data->req).headerline == 0) {
          pcVar7 = Curl_dyn_ptr(pdVar1);
          len = Curl_dyn_len(pdVar1);
          sVar5 = checkprotoprefix(data,(connectdata *)(ulong)conn->handler->protocol,pcVar7,len);
          if (sVar5 == STATUS_BAD) {
            Curl_conncontrol(conn,2);
            if (9 < conn->httpversion) goto LAB_00136605;
            if (((data->set).field_0x8d0 & 0x10) == 0) goto LAB_0013661d;
            puVar2 = &(data->req).field_0xd9;
            *puVar2 = *puVar2 & 0xfe;
            goto LAB_00136576;
          }
        }
        blen = blen - sVar8;
        buf = buf + sVar8;
        pcVar7 = Curl_dyn_ptr(pdVar1);
        sVar8 = Curl_dyn_len(pdVar1);
        CVar4 = http_rw_hd(data,pcVar7,sVar8,buf,blen,&local_38);
        Curl_dyn_reset(pdVar1);
        if (local_38 != 0) {
          blen = blen - local_38;
          buf = buf + local_38;
          *pconsumed = *pconsumed + local_38;
        }
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        if (blen == 0) break;
      }
    }
    if (((data->req).field_0xd9 & 1) == 0) {
      Curl_dyn_free(&(data->state).headerb);
    }
LAB_00136576:
    uVar3 = *(uint *)&(data->req).field_0xd9;
    CVar4 = CURLE_OK;
    if ((uVar3 & 1) == 0) {
      CVar4 = CURLE_OK;
      if ((uVar3 >> 0x11 & 1) == 0) {
        pdVar1 = &(data->state).headerb;
        sVar8 = Curl_dyn_len(pdVar1);
        if (sVar8 != 0) {
          pcVar7 = Curl_dyn_ptr(pdVar1);
          sVar8 = Curl_dyn_len(pdVar1);
          CVar4 = Curl_client_write(data,1,pcVar7,sVar8);
        }
      }
      Curl_dyn_free(&(data->state).headerb);
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_http_write_resp_hds(struct Curl_easy *data,
                                  const char *buf, size_t blen,
                                  size_t *pconsumed)
{
  if(!data->req.header) {
    *pconsumed = 0;
    return CURLE_OK;
  }
  else {
    CURLcode result;

    result = http_parse_headers(data, buf, blen, pconsumed);
    if(!result && !data->req.header) {
      if(!data->req.no_body && Curl_dyn_len(&data->state.headerb)) {
        /* leftover from parsing something that turned out not
         * to be a header, only happens if we allow for
         * HTTP/0.9 like responses */
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   Curl_dyn_ptr(&data->state.headerb),
                                   Curl_dyn_len(&data->state.headerb));
      }
      Curl_dyn_free(&data->state.headerb);
    }
    return result;
  }
}